

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keygen-noise.c
# Opt level: O1

char * get_random_data(int len,char *device)

{
  int iVar1;
  char *pcVar2;
  ssize_t sVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  pcVar2 = (char *)safemalloc((long)len,1,0);
  if (device == (char *)0x0) {
    lVar5 = 0;
    do {
      device = *(char **)((long)get_random_data::default_devices + lVar5);
      iVar1 = access(device,4);
      if (iVar1 == 0) goto LAB_0010d818;
      lVar5 = lVar5 + 8;
    } while (lVar5 == 8);
    device = (char *)0x0;
LAB_0010d818:
    if (device == (char *)0x0) {
      get_random_data_cold_3();
      return (char *)0x0;
    }
  }
  iVar1 = open(device,0);
  if (iVar1 < 0) {
    get_random_data_cold_2();
    return (char *)0x0;
  }
  if (0 < len) {
    uVar6 = 0;
    do {
      sVar3 = read(iVar1,pcVar2 + uVar6,(long)(len - (int)uVar6));
      if ((int)sVar3 < 0) {
        get_random_data_cold_1();
        return (char *)0x0;
      }
      uVar4 = (int)uVar6 + (int)sVar3;
      uVar6 = (ulong)uVar4;
    } while ((int)uVar4 < len);
  }
  close(iVar1);
  return pcVar2;
}

Assistant:

char *get_random_data(int len, const char *device)
{
    char *buf = snewn(len, char);
    int fd;
    int ngot, ret;

    if (!device) {
        static const char *const default_devices[] = {
            "/dev/urandom", "/dev/random"
        };
        size_t i;

        for (i = 0; i < lenof(default_devices); i++) {
            if (access(default_devices[i], R_OK) == 0) {
                device = default_devices[i];
                break;
            }
        }

        if (!device) {
            sfree(buf);
            fprintf(stderr, "puttygen: cannot find a readable "
                    "random number source; use --random-device\n");
            return NULL;
        }
    }

    fd = open(device, O_RDONLY);
    if (fd < 0) {
        sfree(buf);
        fprintf(stderr, "puttygen: %s: open: %s\n",
                device, strerror(errno));
        return NULL;
    }

    ngot = 0;
    while (ngot < len) {
        ret = read(fd, buf+ngot, len-ngot);
        if (ret < 0) {
            close(fd);
            sfree(buf);
            fprintf(stderr, "puttygen: %s: read: %s\n",
                    device, strerror(errno));
            return NULL;
        }
        ngot += ret;
    }

    close(fd);

    return buf;
}